

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_solution.h
# Opt level: O2

void writeResult(Result *sol,ostream *f)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(f,"Instance: ");
  poVar1 = std::operator<<(poVar1,(string *)sol);
  poVar1 = std::operator<<(poVar1," branches: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," time: ");
  poVar1 = std::ostream::_M_insert<double>(sol->time);
  poVar1 = std::operator<<(poVar1," MIS size: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," nDefPicks: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," nStratPicks: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," nDefBranchings: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void writeResult(Result& sol, std::ostream &f) {
    f << "Instance: " << sol.instance
      << " branches: " << sol.nBranchings 
      << " time: " << sol.time 
      << " MIS size: " << sol.misSize
      << " nDefPicks: " << sol.nDefaultPicks
      << " nStratPicks: " << sol.nStratPicks
      << " nDefBranchings: " << sol.nDefaultBranchings
      << std::endl;
}